

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ScrollIndicator::ScrollIndicator
          (ScrollIndicator *this,QColor *c,Orientation o,QWidget *parent)

{
  QFlags<Qt::WindowType> local_2c;
  QWidget *local_28;
  QWidget *parent_local;
  QColor *pQStack_18;
  Orientation o_local;
  QColor *c_local;
  ScrollIndicator *this_local;
  
  local_28 = parent;
  parent_local._4_4_ = o;
  pQStack_18 = c;
  c_local = (QColor *)this;
  QFlags<Qt::WindowType>::QFlags(&local_2c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_2c.i);
  *(undefined ***)this = &PTR_metaObject_00244bd0;
  *(undefined ***)&this->field_0x10 = &PTR__ScrollIndicator_00244d80;
  this->policy = ScrollIndicatorAsNeeded;
  this->minimumSize = 10;
  this->size = this->minimumSize;
  QPoint::QPoint(&this->pos);
  this->width = 3;
  this->orientation = parent_local._4_4_;
  this->needPaint = false;
  *(undefined8 *)&this->color = *(undefined8 *)pQStack_18;
  *(undefined8 *)((long)&(this->color).ct + 4) = *(undefined8 *)((long)&pQStack_18->ct + 4);
  this->animate = false;
  this->alpha = 0xff;
  return;
}

Assistant:

ScrollIndicator::ScrollIndicator( const QColor & c, Qt::Orientation o,
	QWidget * parent )
	:	QWidget( parent )
	,	policy( AbstractScrollArea::ScrollIndicatorAsNeeded )
	,	minimumSize( 10 )
	,	size( minimumSize )
	,	width( 3 )
	,	orientation( o )
	,	needPaint( false )
	,	color( c )
	,	animate( false )
	,	alpha( 255 )
{
}